

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O3

void __thiscall Assimp::glTFImporter::ImportMeshes(glTFImporter *this,Asset *r)

{
  pointer *ppuVar1;
  PrimitiveMode PVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Mesh *pMVar5;
  size_t sVar6;
  iterator iVar7;
  pointer pPVar8;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar9;
  vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *pvVar10;
  BufferView *pBVar11;
  vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *pvVar12;
  long lVar13;
  aiScene *paVar14;
  long lVar15;
  byte bVar16;
  aiMesh **ppaVar17;
  _Alloc_hider _Var18;
  iterator iVar19;
  glTFImporter *pgVar20;
  uint uVar21;
  uint uVar22;
  pointer ppMVar23;
  aiMesh *paVar24;
  ulong *puVar25;
  undefined8 *puVar26;
  uint *puVar27;
  undefined4 *puVar28;
  Logger *pLVar29;
  aiFace *paVar30;
  int *piVar31;
  ulong *puVar32;
  aiMesh **ppaVar33;
  runtime_error *prVar34;
  long *plVar35;
  pointer pRVar36;
  float *pfVar37;
  Accessor *pAVar38;
  ulong uVar39;
  ulong uVar40;
  aiMesh **ppaVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  char *pcVar45;
  ulong uVar46;
  int iVar47;
  aiFace *paVar48;
  pointer pPVar49;
  int iVar50;
  list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_> *plVar51;
  bool bVar52;
  bool bVar53;
  Ref<glTF::Buffer> RVar54;
  uint k;
  Indexer data;
  aiMesh *aim;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  uint local_fc;
  ulong local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [24];
  ulong uStack_d0;
  ulong *local_c8;
  undefined8 uStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  aiMesh **local_98;
  iterator iStack_90;
  aiMesh **local_88;
  glTFImporter *local_78;
  uint local_6c;
  Asset *local_68;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_60;
  LazyDict<glTF::Buffer> *local_58;
  string local_50;
  
  local_98 = (aiMesh **)0x0;
  iStack_90._M_current = (aiMesh **)0x0;
  local_88 = (aiMesh **)0x0;
  local_fc = 0;
  ppMVar23 = (r->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_78 = this;
  local_68 = r;
  if (((long)(r->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar23 & 0x7fffffff8U) != 0) {
    local_58 = &r->buffers;
    local_60 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->meshOffsets;
    uVar42 = 0;
    do {
      pMVar5 = ppMVar23[uVar42];
      if (*(size_t *)
           ((long)&(pMVar5->Extension).
                   super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                   ._M_impl + 0x10) != 0) {
        plVar51 = &pMVar5->Extension;
        while (plVar51 = *(list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                           **)&(plVar51->
                               super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                               )._M_impl._M_node, plVar51 != &pMVar5->Extension) {
          sVar6 = *(size_t *)
                   ((long)&(plVar51->
                           super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                           )._M_impl._M_node + 0x10);
          if (*(int *)(sVar6 + 8) != 0) {
            prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
            to_string<glTF::Mesh::SExtension::EType>(&local_50,*(EType *)(sVar6 + 8));
            std::operator+(&local_b8,"GLTF: Can not import mesh: unknown mesh extension (code: \"",
                           &local_50);
            plVar35 = (long *)std::__cxx11::string::append((char *)&local_b8);
            local_e8._0_8_ = *plVar35;
            pAVar38 = (Accessor *)(plVar35 + 2);
            if ((Accessor *)local_e8._0_8_ == pAVar38) {
              local_e8._16_8_ = (pAVar38->super_Object)._vptr_Object;
              uStack_d0 = plVar35[3];
              local_e8._0_8_ = (Accessor *)(local_e8 + 0x10);
            }
            else {
              local_e8._16_8_ = (pAVar38->super_Object)._vptr_Object;
            }
            local_e8._8_8_ = plVar35[1];
            *plVar35 = (long)pAVar38;
            plVar35[1] = 0;
            *(undefined1 *)(plVar35 + 2) = 0;
            std::runtime_error::runtime_error(prVar34,(string *)local_e8);
            *(undefined ***)prVar34 = &PTR__runtime_error_0080bf48;
            __cxa_throw(prVar34,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (2 < (ulong)(((long)*(pointer *)
                                  ((long)&(pMVar5->primitives).
                                          super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                          ._M_impl + 8) -
                           *(long *)&(pMVar5->primitives).
                                     super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                     ._M_impl.super__Vector_impl_data >> 4) * 0x4ec4ec4ec4ec4ec5)) {
            prVar34 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_e8._0_8_ = local_e8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e8,
                       "GLTF: When using Open3DGC compression then only one primitive per mesh are allowed."
                       ,"");
            std::runtime_error::runtime_error(prVar34,(string *)local_e8);
            *(undefined ***)prVar34 = &PTR__runtime_error_0080bf48;
            __cxa_throw(prVar34,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          RVar54 = glTF::LazyDict<glTF::Buffer>::Get(local_58,*(char **)(sVar6 + 0x10));
          glTF::Buffer::EncodedRegion_SetCurrent
                    (((RVar54.vector)->
                     super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[RVar54._8_8_ & 0xffffffff],
                     &(pMVar5->super_Object).id);
        }
      }
      iVar7._M_current =
           (local_78->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (local_78->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_60,iVar7,&local_fc);
      }
      else {
        *iVar7._M_current = local_fc;
        ppuVar1 = &(local_78->meshOffsets).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      pPVar49 = (pMVar5->primitives).
                super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar8 = *(pointer *)
                ((long)&(pMVar5->primitives).
                        super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                        ._M_impl + 8);
      local_fc = (int)((ulong)((long)pPVar8 - (long)pPVar49) >> 4) * -0x3b13b13b + local_fc;
      if (pPVar8 != pPVar49) {
        uVar40 = 0;
        do {
          paVar24 = (aiMesh *)operator_new(0x520);
          paVar24->mPrimitiveTypes = 0;
          paVar24->mNumVertices = 0;
          paVar24->mNumFaces = 0;
          memset(&paVar24->mVertices,0,0xcc);
          paVar24->mBones = (aiBone **)0x0;
          paVar24->mMaterialIndex = 0;
          (paVar24->mName).length = 0;
          (paVar24->mName).data[0] = '\0';
          memset((paVar24->mName).data + 1,0x1b,0x3ff);
          paVar24->mNumAnimMeshes = 0;
          paVar24->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar24->mMethod = 0;
          (paVar24->mAABB).mMin.x = 0.0;
          (paVar24->mAABB).mMin.y = 0.0;
          (paVar24->mAABB).mMin.z = 0.0;
          (paVar24->mAABB).mMax.x = 0.0;
          (paVar24->mAABB).mMax.y = 0.0;
          (paVar24->mAABB).mMax.z = 0.0;
          memset(paVar24->mColors,0,0xa0);
          local_b8._M_dataplus._M_p = (pointer)paVar24;
          if (iStack_90._M_current == local_88) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_98,iStack_90,
                       (aiMesh **)&local_b8);
          }
          else {
            *iStack_90._M_current = paVar24;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
          _Var18._M_p = local_b8._M_dataplus._M_p;
          uVar39 = (pMVar5->super_Object).id._M_string_length;
          if (uVar39 < 0x400) {
            ((aiString *)(local_b8._M_dataplus._M_p + 0xec))->length = (uint)uVar39;
            memcpy(local_b8._M_dataplus._M_p + 0xf0,(pMVar5->super_Object).id._M_dataplus._M_p,
                   uVar39);
            _Var18._M_p[uVar39 + 0xf0] = '\0';
          }
          iVar50 = (int)uVar40;
          if (1 < (ulong)(((long)*(pointer *)
                                  ((long)&(pMVar5->primitives).
                                          super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                          ._M_impl + 8) -
                           *(long *)&(pMVar5->primitives).
                                     super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                     ._M_impl.super__Vector_impl_data >> 4) * 0x4ec4ec4ec4ec4ec5)) {
            uVar21 = ((aiString *)(local_b8._M_dataplus._M_p + 0xec))->length;
            local_b8._M_dataplus._M_p[(ulong)uVar21 + 0xf0] = '-';
            pcVar45 = local_b8._M_dataplus._M_p + (ulong)uVar21 + 0xf1;
            uVar43 = 0x3ff - uVar21;
            uVar44 = 1;
            uVar39 = uVar40;
            if ((iVar50 < 0) && (1 < uVar43)) {
              local_b8._M_dataplus._M_p[(ulong)uVar21 + 0xf1] = '-';
              pcVar45 = local_b8._M_dataplus._M_p + (ulong)uVar21 + 0xf2;
              uVar39 = (ulong)(uint)-iVar50;
              uVar44 = 2;
            }
            if (uVar44 < uVar43) {
              iVar47 = 1000000000;
              bVar16 = 0;
              do {
                lVar15 = (long)(int)uVar39 / (long)iVar47;
                bVar52 = (int)lVar15 != 0;
                bVar53 = iVar47 == 1;
                if ((bool)(bVar16 | bVar53 | bVar52)) {
                  *pcVar45 = (char)lVar15 + '0';
                  pcVar45 = pcVar45 + 1;
                  uVar44 = uVar44 + 1;
                  uVar39 = (long)(int)uVar39 % (long)iVar47 & 0xffffffff;
                  if (iVar47 == 1) break;
                }
                iVar47 = iVar47 / 10;
                bVar16 = bVar16 | bVar53 | bVar52;
              } while (uVar44 < uVar43);
            }
            *pcVar45 = '\0';
            ((aiString *)(local_b8._M_dataplus._M_p + 0xec))->length =
                 ((aiString *)(local_b8._M_dataplus._M_p + 0xec))->length + uVar44;
          }
          pPVar49 = pPVar49 + uVar40;
          if ((ulong)pPVar49->mode < 7) {
            *(uint *)local_b8._M_dataplus._M_p =
                 *(uint *)local_b8._M_dataplus._M_p |
                 *(uint *)(&DAT_006f9650 + (ulong)pPVar49->mode * 4);
          }
          pRVar36 = *(pointer *)
                     &(pPVar49->attributes).position.
                      super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                      ._M_impl;
          if ((*(pointer *)
                ((long)&(pPVar49->attributes).position.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                + 8) != pRVar36) &&
             (pRVar36->vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0)
             ) {
            *(uint *)(local_b8._M_dataplus._M_p + 4) =
                 *(uint *)(*(long *)(*(long *)&(pRVar36->vector->
                                               super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                               )._M_impl + (ulong)pRVar36->index * 8) + 100);
            puVar26 = *(undefined8 **)
                       &(pPVar49->attributes).position.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                        ._M_impl;
            glTF::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)(*(long *)*puVar26 + (ulong)*(uint *)(puVar26 + 1) * 8),
                       (aiVector3t<float> **)(local_b8._M_dataplus._M_p + 0x10));
          }
          pRVar36 = (pPVar49->attributes).normal.
                    super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((*(pointer *)
                ((long)&(pPVar49->attributes).normal.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                + 8) != pRVar36) &&
             (pRVar36->vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0)
             ) {
            glTF::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (*(long *)&(pRVar36->vector->
                                   super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                   )._M_impl + (ulong)pRVar36->index * 8),
                       (aiVector3t<float> **)(local_b8._M_dataplus._M_p + 0x18));
          }
          pRVar36 = (pPVar49->attributes).texcoord.
                    super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(pPVar49->attributes).texcoord.
                       super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
               + 8) != pRVar36) {
            uVar40 = 0;
            do {
              glTF::Accessor::ExtractData<aiVector3t<float>>
                        (*(Accessor **)
                          (*(long *)&((pRVar36[uVar40].vector)->
                                     super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                     )._M_impl + (ulong)pRVar36[uVar40].index * 8),
                         (aiVector3t<float> **)(local_b8._M_dataplus._M_p + uVar40 * 8 + 0x70));
              lVar15 = *(long *)&(pPVar49->attributes).texcoord.
                                 super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                                 ._M_impl.super__Vector_impl_data;
              *(undefined4 *)(local_b8._M_dataplus._M_p + uVar40 * 4 + 0xb0) =
                   *(undefined4 *)
                    (&DAT_0080c488 +
                    (ulong)*(uint *)(*(long *)(**(long **)(lVar15 + uVar40 * 0x10) +
                                              (ulong)*(uint *)(lVar15 + 8 + uVar40 * 0x10) * 8) +
                                    0x68) * 0x10);
              if (*(uint *)(local_b8._M_dataplus._M_p + 4) != 0) {
                pfVar37 = (float *)(*(long *)(local_b8._M_dataplus._M_p + uVar40 * 8 + 0x70) + 4);
                uVar39 = 0;
                do {
                  *pfVar37 = 1.0 - *pfVar37;
                  uVar39 = uVar39 + 1;
                  pfVar37 = pfVar37 + 3;
                } while (uVar39 < *(uint *)(local_b8._M_dataplus._M_p + 4));
              }
              if (6 < uVar40) break;
              uVar40 = uVar40 + 1;
              pRVar36 = (pPVar49->attributes).texcoord.
                        super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar40 < (ulong)((long)*(pointer *)
                                             ((long)&(pPVar49->attributes).texcoord.
                                                                                                          
                                                  super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                                             + 8) - (long)pRVar36 >> 4));
          }
          pvVar9 = (pPVar49->indices).vector;
          if (pvVar9 != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
            pAVar38 = *(Accessor **)
                       (*(long *)&(pvVar9->
                                  super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                                  )._M_impl + (ulong)(pPVar49->indices).index * 8);
            local_f8 = (ulong)pAVar38->count;
            pvVar10 = (pAVar38->bufferView).vector;
            if (pvVar10 == (vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *)0x0) {
LAB_0063f998:
              local_e8._8_8_ = (uint8_t *)0x0;
            }
            else {
              pBVar11 = (pvVar10->
                        super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)
                        ._M_impl.super__Vector_impl_data._M_start[(pAVar38->bufferView).index];
              pvVar12 = (pBVar11->buffer).vector;
              if (pvVar12 == (vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *)0x0)
              goto LAB_0063f998;
              lVar15 = *(long *)(*(long *)&pvVar12->
                                           super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>
                                + (ulong)(pBVar11->buffer).index * 8);
              lVar13 = *(long *)(lVar15 + 0x60);
              if (lVar13 == 0) goto LAB_0063f998;
              uVar40 = (ulong)pAVar38->byteOffset + pBVar11->byteOffset;
              puVar25 = *(ulong **)(lVar15 + 0x58);
              if (puVar25 == (ulong *)0x0) {
LAB_0063fae5:
                local_e8._8_8_ = lVar13 + uVar40;
              }
              else {
                uVar39 = *puVar25;
                if ((uVar40 < uVar39) || (uVar39 + puVar25[3] <= uVar40)) goto LAB_0063fae5;
                local_e8._8_8_ = (uVar40 - uVar39) + puVar25[2];
              }
            }
            local_e8._0_8_ = pAVar38;
            uVar21 = glTF::Accessor::GetElementSize(pAVar38);
            uVar40 = local_f8;
            local_e8._16_8_ = ZEXT48(uVar21);
            uStack_d0 = (ulong)pAVar38->byteStride;
            if ((ulong)pAVar38->byteStride == 0) {
              uStack_d0 = local_e8._16_8_;
            }
            if ((uint8_t *)local_e8._8_8_ == (uint8_t *)0x0) {
              __assert_fail("data.IsValid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFImporter.cpp"
                            ,0x142,"void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
            }
            uVar21 = (uint)local_f8;
            switch(pPVar49->mode) {
            case PrimitiveMode_POINTS:
              puVar25 = (ulong *)operator_new__(local_f8 * 0x10 + 8);
              *puVar25 = local_f8;
              paVar48 = (aiFace *)(puVar25 + 1);
              uVar39 = 0;
              if ((int)local_f8 != 0) {
                paVar30 = paVar48;
                do {
                  paVar30->mNumIndices = 0;
                  paVar30->mIndices = (uint *)0x0;
                  paVar30 = paVar30 + 1;
                } while (paVar30 != paVar48 + uVar40);
                if ((int)local_f8 != 0) {
                  uVar40 = 0;
                  do {
                    uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>
                                       ((Indexer *)local_e8,(int)uVar40);
                    *(undefined4 *)(puVar25 + 1) = 1;
                    puVar27 = (uint *)operator_new__(4);
                    puVar25[2] = (ulong)puVar27;
                    *puVar27 = uVar21;
                    uVar40 = uVar40 + 1;
                    uVar39 = local_f8;
                    puVar25 = puVar25 + 2;
                  } while (local_f8 != uVar40);
                }
              }
              break;
            case PrimitiveMode_LINES:
              if ((uVar21 & 0xfffffffe) != uVar21) {
                pLVar29 = DefaultLogger::get();
                Logger::warn(pLVar29,
                             "The number of vertices was not compatible with the LINES mode. Some vertices were dropped."
                            );
                uVar21 = uVar21 & 0xfffffffe;
              }
              uVar39 = local_f8 >> 1 & 0x7fffffff;
              puVar25 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
              *puVar25 = uVar39;
              paVar48 = (aiFace *)(puVar25 + 1);
              if (1 < (uint)local_f8) {
                paVar30 = paVar48;
                do {
                  paVar30->mNumIndices = 0;
                  paVar30->mIndices = (uint *)0x0;
                  paVar30 = paVar30 + 1;
                } while (paVar30 != paVar48 + uVar39);
              }
              if (uVar21 != 0) {
                uVar40 = 0;
                do {
                  uVar43 = glTF::Accessor::Indexer::GetValue<unsigned_int>
                                     ((Indexer *)local_e8,(int)uVar40);
                  uVar44 = glTF::Accessor::Indexer::GetValue<unsigned_int>
                                     ((Indexer *)local_e8,(int)uVar40 + 1);
                  *(undefined4 *)(puVar25 + uVar40 + 1) = 2;
                  puVar27 = (uint *)operator_new__(8);
                  puVar25[uVar40 + 2] = (ulong)puVar27;
                  *puVar27 = uVar43;
                  puVar27[1] = uVar44;
                  uVar40 = uVar40 + 2;
                } while (uVar40 < uVar21);
              }
              break;
            case PrimitiveMode_LINE_LOOP:
            case PrimitiveMode_LINE_STRIP:
              uVar21 = uVar21 - (pPVar49->mode == PrimitiveMode_LINE_STRIP);
              uVar39 = (ulong)uVar21;
              puVar25 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
              *puVar25 = uVar39;
              paVar48 = (aiFace *)(puVar25 + 1);
              if (uVar21 != 0) {
                paVar30 = paVar48;
                do {
                  paVar30->mNumIndices = 0;
                  paVar30->mIndices = (uint *)0x0;
                  paVar30 = paVar30 + 1;
                } while (paVar30 != paVar48 + uVar39);
              }
              uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)local_e8,0);
              uVar43 = glTF::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)local_e8,1);
              paVar48->mNumIndices = 2;
              puVar27 = (uint *)operator_new__(8);
              puVar25[2] = (ulong)puVar27;
              *puVar27 = uVar21;
              puVar27[1] = uVar43;
              if (2 < (uint)local_f8) {
                puVar32 = puVar25 + 4;
                uVar40 = 2;
                do {
                  uVar3 = *(undefined4 *)(puVar32[-2] + 4);
                  uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>
                                     ((Indexer *)local_e8,(int)uVar40);
                  *(undefined4 *)(puVar32 + -1) = 2;
                  puVar28 = (undefined4 *)operator_new__(8);
                  *puVar32 = (ulong)puVar28;
                  *puVar28 = uVar3;
                  puVar28[1] = uVar21;
                  uVar40 = uVar40 + 1;
                  puVar32 = puVar32 + 2;
                } while (local_f8 != uVar40);
              }
              if (pPVar49->mode == PrimitiveMode_LINE_LOOP) {
                uVar44 = (int)local_f8 - 1;
                uVar21 = *(uint *)(puVar25[(ulong)((int)local_f8 - 2) * 2 + 2] + 4);
                uVar43 = *(uint *)puVar25[2];
                paVar48[uVar44].mNumIndices = 2;
                puVar27 = (uint *)operator_new__(8);
                paVar48[uVar44].mIndices = puVar27;
                *puVar27 = uVar21;
                puVar27[1] = uVar43;
              }
              break;
            case PrimitiveMode_TRIANGLES:
              uVar39 = (local_f8 & 0xffffffff) / 3;
              uVar43 = (int)((local_f8 & 0xffffffff) / 3) * 3;
              local_c8 = (ulong *)CONCAT44(local_c8._4_4_,uVar21);
              if (uVar43 != uVar21) {
                pLVar29 = DefaultLogger::get();
                Logger::warn(pLVar29,
                             "The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped."
                            );
                local_c8 = (ulong *)CONCAT44(local_c8._4_4_,uVar43);
              }
              puVar25 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
              *puVar25 = uVar39;
              paVar48 = (aiFace *)(puVar25 + 1);
              if (2 < (uint)local_f8) {
                paVar30 = paVar48;
                do {
                  paVar30->mNumIndices = 0;
                  paVar30->mIndices = (uint *)0x0;
                  paVar30 = paVar30 + 1;
                } while (paVar30 != paVar48 + uVar39);
              }
              if ((uint)local_c8 != 0) {
                uVar21 = 0;
                do {
                  uVar40 = (ulong)uVar21 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                  uVar43 = glTF::Accessor::Indexer::GetValue<unsigned_int>
                                     ((Indexer *)local_e8,uVar21);
                  uVar44 = glTF::Accessor::Indexer::GetValue<unsigned_int>
                                     ((Indexer *)local_e8,uVar21 + 1);
                  uVar22 = glTF::Accessor::Indexer::GetValue<unsigned_int>
                                     ((Indexer *)local_e8,uVar21 + 2);
                  *(undefined4 *)((long)&paVar48->mNumIndices + uVar40) = 3;
                  puVar27 = (uint *)operator_new__(0xc);
                  *(uint **)((long)&paVar48->mIndices + uVar40) = puVar27;
                  *puVar27 = uVar43;
                  puVar27[1] = uVar44;
                  puVar27[2] = uVar22;
                  uVar21 = uVar21 + 3;
                } while (uVar21 < (uint)local_c8);
              }
              break;
            case PrimitiveMode_TRIANGLE_STRIP:
              uVar39 = (ulong)(uVar21 - 2);
              puVar25 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
              *puVar25 = uVar39;
              paVar48 = (aiFace *)(puVar25 + 1);
              if (uVar21 - 2 != 0) {
                paVar30 = paVar48;
                do {
                  paVar30->mNumIndices = 0;
                  paVar30->mIndices = (uint *)0x0;
                  paVar30 = paVar30 + 1;
                } while (paVar30 != paVar48 + uVar39);
              }
              uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)local_e8,0);
              local_c8 = (ulong *)CONCAT44(local_c8._4_4_,uVar21);
              uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)local_e8,1);
              uVar43 = glTF::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)local_e8,2);
              paVar48->mNumIndices = 3;
              puVar28 = (undefined4 *)operator_new__(0xc);
              puVar25[2] = (ulong)puVar28;
              *puVar28 = (uint)local_c8;
              puVar28[1] = uVar21;
              puVar28[2] = uVar43;
              if (3 < (uint)local_f8) {
                puVar25 = puVar25 + 3;
                uVar40 = 3;
                do {
                  local_c8 = *(ulong **)(puVar25[3] + 4);
                  uStack_c0 = 0;
                  uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>
                                     ((Indexer *)local_e8,(int)uVar40);
                  *(undefined4 *)puVar25 = 3;
                  puVar26 = (undefined8 *)operator_new__(0xc);
                  puVar25[1] = (ulong)puVar26;
                  *puVar26 = local_c8;
                  *(uint *)(puVar26 + 1) = uVar21;
                  uVar40 = uVar40 + 1;
                  puVar25 = puVar25 + 2;
                } while (local_f8 != uVar40);
              }
              break;
            case PrimitiveMode_TRIANGLE_FAN:
              uVar39 = (ulong)(uVar21 - 2);
              local_c8 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
              *local_c8 = uVar39;
              paVar48 = (aiFace *)(local_c8 + 1);
              if (uVar21 - 2 != 0) {
                paVar30 = paVar48;
                do {
                  paVar30->mNumIndices = 0;
                  paVar30->mIndices = (uint *)0x0;
                  paVar30 = paVar30 + 1;
                } while (paVar30 != paVar48 + uVar39);
              }
              local_6c = glTF::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)local_e8,0);
              uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)local_e8,1);
              uVar43 = glTF::Accessor::Indexer::GetValue<unsigned_int>((Indexer *)local_e8,2);
              paVar48->mNumIndices = 3;
              puVar27 = (uint *)operator_new__(0xc);
              local_c8[2] = (ulong)puVar27;
              *puVar27 = local_6c;
              puVar27[1] = uVar21;
              puVar27[2] = uVar43;
              if (3 < (uint)local_f8) {
                puVar25 = local_c8 + 3;
                uVar40 = 3;
                do {
                  uVar3 = *(undefined4 *)local_c8[2];
                  uVar4 = *(undefined4 *)(puVar25[3] + 8);
                  uVar21 = glTF::Accessor::Indexer::GetValue<unsigned_int>
                                     ((Indexer *)local_e8,(int)uVar40);
                  *(undefined4 *)puVar25 = 3;
                  puVar28 = (undefined4 *)operator_new__(0xc);
                  puVar25[1] = (ulong)puVar28;
                  *puVar28 = uVar3;
                  puVar28[1] = uVar4;
                  puVar28[2] = uVar21;
                  uVar40 = uVar40 + 1;
                  puVar25 = puVar25 + 2;
                } while (local_f8 != uVar40);
              }
              break;
            default:
              goto switchD_0063fb38_default;
            }
            goto LAB_0064057e;
          }
          PVar2 = pPVar49->mode;
          if (PVar2 < (PrimitiveMode_TRIANGLE_FAN|PrimitiveMode_LINES)) {
            uVar21 = *(uint *)(local_b8._M_dataplus._M_p + 4);
            uVar40 = (ulong)uVar21;
            switch(PVar2) {
            case PrimitiveMode_POINTS:
              puVar25 = (ulong *)operator_new__(uVar40 * 0x10 + 8);
              *puVar25 = uVar40;
              paVar48 = (aiFace *)(puVar25 + 1);
              if (uVar21 != 0) {
                paVar30 = paVar48;
                do {
                  paVar30->mNumIndices = 0;
                  paVar30->mIndices = (uint *)0x0;
                  paVar30 = paVar30 + 1;
                } while (paVar30 != paVar48 + uVar40);
                if (uVar21 != 0) {
                  uVar46 = 0;
                  do {
                    *(undefined4 *)(puVar25 + 1) = 1;
                    puVar28 = (undefined4 *)operator_new__(4);
                    puVar25[2] = (ulong)puVar28;
                    *puVar28 = (int)uVar46;
                    uVar46 = uVar46 + 1;
                    uVar39 = uVar40;
                    puVar25 = puVar25 + 2;
                  } while (uVar40 != uVar46);
                  break;
                }
              }
              *(aiFace **)(local_b8._M_dataplus._M_p + 0xd0) = paVar48;
              *(uint *)(local_b8._M_dataplus._M_p + 8) = 0;
              goto switchD_0063fb38_default;
            case PrimitiveMode_LINES:
              uVar43 = uVar21;
              if ((uVar21 & 0xfffffffe) != uVar21) {
                pLVar29 = DefaultLogger::get();
                Logger::warn(pLVar29,
                             "The number of vertices was not compatible with the LINES mode. Some vertices were dropped."
                            );
                uVar43 = uVar21 & 0xfffffffe;
              }
              uVar39 = (ulong)(uVar21 >> 1);
              puVar25 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
              *puVar25 = uVar39;
              paVar48 = (aiFace *)(puVar25 + 1);
              if (1 < uVar21) {
                paVar30 = paVar48;
                do {
                  paVar30->mNumIndices = 0;
                  paVar30->mIndices = (uint *)0x0;
                  paVar30 = paVar30 + 1;
                } while (paVar30 != paVar48 + uVar39);
              }
              if (uVar43 != 0) {
                uVar40 = 0;
                do {
                  *(undefined4 *)(puVar25 + uVar40 + 1) = 2;
                  piVar31 = (int *)operator_new__(8);
                  puVar25[uVar40 + 2] = (ulong)piVar31;
                  *piVar31 = (int)uVar40;
                  piVar31[1] = (int)uVar40 + 1;
                  uVar40 = uVar40 + 2;
                } while (uVar40 < uVar43);
              }
              break;
            default:
              uVar43 = uVar21 - (PVar2 == PrimitiveMode_LINE_STRIP);
              uVar39 = (ulong)uVar43;
              puVar25 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
              *puVar25 = uVar39;
              paVar48 = (aiFace *)(puVar25 + 1);
              if (uVar43 != 0) {
                paVar30 = paVar48;
                do {
                  paVar30->mNumIndices = 0;
                  paVar30->mIndices = (uint *)0x0;
                  paVar30 = paVar30 + 1;
                } while (paVar30 != paVar48 + uVar39);
              }
              paVar48->mNumIndices = 2;
              puVar26 = (undefined8 *)operator_new__(8);
              puVar25[2] = (ulong)puVar26;
              *puVar26 = 0x100000000;
              if (2 < uVar21) {
                puVar32 = puVar25 + 4;
                uVar46 = 2;
                do {
                  uVar3 = *(undefined4 *)(puVar32[-2] + 4);
                  *(undefined4 *)(puVar32 + -1) = 2;
                  puVar28 = (undefined4 *)operator_new__(8);
                  *puVar32 = (ulong)puVar28;
                  *puVar28 = uVar3;
                  puVar28[1] = (int)uVar46;
                  uVar46 = uVar46 + 1;
                  puVar32 = puVar32 + 2;
                } while (uVar40 != uVar46);
              }
              if (pPVar49->mode == PrimitiveMode_LINE_LOOP) {
                uVar43 = *(uint *)(puVar25[(ulong)(uVar21 - 2) * 2 + 2] + 4);
                uVar44 = *(uint *)puVar25[2];
                paVar48[uVar21 - 1].mNumIndices = 2;
                puVar27 = (uint *)operator_new__(8);
                paVar48[uVar21 - 1].mIndices = puVar27;
                *puVar27 = uVar43;
                puVar27[1] = uVar44;
              }
              break;
            case PrimitiveMode_TRIANGLES:
              uVar39 = uVar40 / 3;
              uVar43 = (uVar21 / 3) * 3;
              uVar44 = uVar21;
              if (uVar43 != uVar21) {
                pLVar29 = DefaultLogger::get();
                Logger::warn(pLVar29,
                             "The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped."
                            );
                uVar44 = uVar43;
              }
              puVar25 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
              *puVar25 = uVar39;
              paVar48 = (aiFace *)(puVar25 + 1);
              if (2 < uVar21) {
                paVar30 = paVar48;
                do {
                  paVar30->mNumIndices = 0;
                  paVar30->mIndices = (uint *)0x0;
                  paVar30 = paVar30 + 1;
                } while (paVar30 != paVar48 + uVar39);
              }
              if (uVar44 != 0) {
                uVar21 = 0;
                do {
                  uVar40 = (ulong)uVar21 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                  *(undefined4 *)((long)&paVar48->mNumIndices + uVar40) = 3;
                  puVar27 = (uint *)operator_new__(0xc);
                  *(uint **)((long)&paVar48->mIndices + uVar40) = puVar27;
                  *puVar27 = uVar21;
                  puVar27[1] = uVar21 + 1;
                  puVar27[2] = uVar21 + 2;
                  uVar21 = uVar21 + 3;
                } while (uVar21 < uVar44);
              }
              break;
            case PrimitiveMode_TRIANGLE_STRIP:
              uVar39 = (ulong)(uVar21 - 2);
              puVar25 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
              *puVar25 = uVar39;
              paVar48 = (aiFace *)(puVar25 + 1);
              if (uVar21 - 2 != 0) {
                paVar30 = paVar48;
                do {
                  paVar30->mNumIndices = 0;
                  paVar30->mIndices = (uint *)0x0;
                  paVar30 = paVar30 + 1;
                } while (paVar30 != paVar48 + uVar39);
              }
              paVar48->mNumIndices = 3;
              puVar26 = (undefined8 *)operator_new__(0xc);
              puVar25[2] = (ulong)puVar26;
              *puVar26 = 0x100000000;
              *(undefined4 *)(puVar26 + 1) = 2;
              if (3 < uVar21) {
                puVar25 = puVar25 + 3;
                uVar46 = 3;
                do {
                  local_f8 = *(ulong *)(puVar25[3] + 4);
                  uStack_f0 = 0;
                  *(undefined4 *)puVar25 = 3;
                  puVar32 = (ulong *)operator_new__(0xc);
                  puVar25[1] = (ulong)puVar32;
                  *puVar32 = local_f8;
                  *(int *)(puVar32 + 1) = (int)uVar46;
                  uVar46 = uVar46 + 1;
                  puVar25 = puVar25 + 2;
                } while (uVar40 != uVar46);
              }
              break;
            case PrimitiveMode_TRIANGLE_FAN:
              uVar39 = (ulong)(uVar21 - 2);
              puVar25 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
              *puVar25 = uVar39;
              paVar48 = (aiFace *)(puVar25 + 1);
              if (uVar21 - 2 != 0) {
                paVar30 = paVar48;
                do {
                  paVar30->mNumIndices = 0;
                  paVar30->mIndices = (uint *)0x0;
                  paVar30 = paVar30 + 1;
                } while (paVar30 != paVar48 + uVar39);
              }
              paVar48->mNumIndices = 3;
              puVar26 = (undefined8 *)operator_new__(0xc);
              puVar25[2] = (ulong)puVar26;
              *puVar26 = 0x100000000;
              *(undefined4 *)(puVar26 + 1) = 2;
              if (3 < uVar21) {
                puVar32 = puVar25 + 3;
                uVar46 = 3;
                local_f8 = uVar40;
                do {
                  uVar3 = *(undefined4 *)puVar25[2];
                  uVar4 = *(undefined4 *)(puVar32[3] + 8);
                  *(undefined4 *)puVar32 = 3;
                  puVar28 = (undefined4 *)operator_new__(0xc);
                  puVar32[1] = (ulong)puVar28;
                  *puVar28 = uVar3;
                  puVar28[1] = uVar4;
                  puVar28[2] = (int)uVar46;
                  uVar46 = uVar46 + 1;
                  puVar32 = puVar32 + 2;
                } while (local_f8 != uVar46);
              }
            }
LAB_0064057e:
            *(aiFace **)(local_b8._M_dataplus._M_p + 0xd0) = paVar48;
            *(uint *)(local_b8._M_dataplus._M_p + 8) = (uint)uVar39;
            if ((uint)uVar39 != 0) {
              uVar40 = 0;
              bVar52 = false;
              do {
                if ((ulong)paVar48[uVar40].mNumIndices != 0) {
                  uVar46 = 0;
                  do {
                    if (*(uint *)(local_b8._M_dataplus._M_p + 4) <= paVar48[uVar40].mIndices[uVar46]
                       ) {
                      if (!bVar52) {
                        __assert_fail("CheckValidFacesIndices(faces, nFaces, aim->mNumVertices)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFImporter.cpp"
                                      ,0x1d5,
                                      "void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
                      }
                      goto switchD_0063fb38_default;
                    }
                    uVar46 = uVar46 + 1;
                  } while (paVar48[uVar40].mNumIndices != uVar46);
                }
                uVar40 = uVar40 + 1;
                bVar52 = (uVar39 & 0xffffffff) <= uVar40;
              } while (uVar40 != (uVar39 & 0xffffffff));
            }
          }
switchD_0063fb38_default:
          if ((pPVar49->material).vector !=
              (vector<glTF::Material_*,_std::allocator<glTF::Material_*>_> *)0x0) {
            *(uint *)(local_b8._M_dataplus._M_p + 0xe8) = (pPVar49->material).index;
          }
          uVar40 = (ulong)(iVar50 + 1);
          pPVar49 = (pMVar5->primitives).
                    super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar39 = ((long)*(pointer *)
                           ((long)&(pMVar5->primitives).
                                   super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                   ._M_impl + 8) - (long)pPVar49 >> 4) * 0x4ec4ec4ec4ec4ec5;
        } while (uVar40 <= uVar39 && uVar39 - uVar40 != 0);
      }
      uVar42 = uVar42 + 1;
      ppMVar23 = (local_68->meshes).mObjs.
                 super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar42 < ((ulong)((long)(local_68->meshes).mObjs.
                                     super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar23) >>
                       3 & 0xffffffff));
  }
  pgVar20 = local_78;
  iVar7._M_current =
       (local_78->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (local_78->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78->meshOffsets,iVar7,
               &local_fc);
  }
  else {
    *iVar7._M_current = local_fc;
    ppuVar1 = &(local_78->meshOffsets).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  iVar19._M_current = iStack_90._M_current;
  ppaVar17 = local_98;
  paVar14 = pgVar20->mScene;
  uVar21 = (uint)((ulong)((long)iStack_90._M_current - (long)local_98) >> 3);
  paVar14->mNumMeshes = uVar21;
  ppaVar41 = local_98;
  if (uVar21 != 0) {
    ppaVar33 = (aiMesh **)operator_new__((long)iStack_90._M_current - (long)local_98 & 0x7fffffff8);
    paVar14->mMeshes = ppaVar33;
    ppaVar41 = ppaVar17;
    for (; ppaVar17 != iVar19._M_current; ppaVar17 = ppaVar17 + 1) {
      paVar24 = *ppaVar17;
      *ppaVar17 = *ppaVar33;
      *ppaVar33 = paVar24;
      ppaVar33 = ppaVar33 + 1;
      ppaVar41 = local_98;
    }
  }
  if (ppaVar41 != (aiMesh **)0x0) {
    operator_delete(ppaVar41,(long)local_88 - (long)ppaVar41);
  }
  return;
}

Assistant:

void glTFImporter::ImportMeshes(glTF::Asset& r)
{
    std::vector<aiMesh*> meshes;

    unsigned int k = 0;

    for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
        Mesh& mesh = r.meshes[m];

		// Check if mesh extensions is used
		if(mesh.Extension.size() > 0)
		{
			for(Mesh::SExtension* cur_ext : mesh.Extension)
			{
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
				if(cur_ext->Type == Mesh::SExtension::EType::Compression_Open3DGC)
				{
					// Limitations for meshes when using Open3DGC-compression.
					// It's a current limitation of sp... Specification have not this part still - about mesh compression. Why only one primitive?
					// Because glTF is very flexibly. But in fact it ugly flexible. Every primitive can has own set of accessors and accessors can
					// point to a-a-a-a-any part of buffer (through bufferview of course) and even to another buffer. We know that "Open3DGC-compression"
					// is applicable only to part of buffer. As we can't guaranty continuity of the data for decoder, we will limit quantity of primitives.
					// Yes indices, coordinates etc. still can br stored in different buffers, but with current specification it's a exporter problem.
					// Also primitive can has only one of "POSITION", "NORMAL" and less then "AI_MAX_NUMBER_OF_TEXTURECOORDS" of "TEXCOORD". All accessor
					// of primitive must point to one continuous region of the buffer.
					if(mesh.primitives.size() > 2) throw DeadlyImportError("GLTF: When using Open3DGC compression then only one primitive per mesh are allowed.");

					Mesh::SCompression_Open3DGC* o3dgc_ext = (Mesh::SCompression_Open3DGC*)cur_ext;
					Ref<Buffer> buf = r.buffers.Get(o3dgc_ext->Buffer);

					buf->EncodedRegion_SetCurrent(mesh.id);
				}
				else
#endif
				{
					throw DeadlyImportError("GLTF: Can not import mesh: unknown mesh extension (code: \"" + to_string(cur_ext->Type) +
											"\"), only Open3DGC is supported.");
				}
			}
		}// if(mesh.Extension.size() > 0)

		meshOffsets.push_back(k);
        k += unsigned(mesh.primitives.size());

        for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
            Mesh::Primitive& prim = mesh.primitives[p];

            aiMesh* aim = new aiMesh();
            meshes.push_back(aim);

            aim->mName = mesh.id;
            if (mesh.primitives.size() > 1) {
                ai_uint32& len = aim->mName.length;
                aim->mName.data[len] = '-';
                len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
            }

            switch (prim.mode) {
                case PrimitiveMode_POINTS:
                    aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;

                case PrimitiveMode_LINES:
                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP:
                    aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;

                case PrimitiveMode_TRIANGLES:
                case PrimitiveMode_TRIANGLE_STRIP:
                case PrimitiveMode_TRIANGLE_FAN:
                    aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
            }

            Mesh::Primitive::Attributes& attr = prim.attributes;

			if (attr.position.size() > 0 && attr.position[0]) {
                aim->mNumVertices = attr.position[0]->count;
                attr.position[0]->ExtractData(aim->mVertices);
			}

			if (attr.normal.size() > 0 && attr.normal[0]) attr.normal[0]->ExtractData(aim->mNormals);

            for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
                attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
                aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

                aiVector3D* values = aim->mTextureCoords[tc];
                for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
                    values[i].y = 1 - values[i].y; // Flip Y coords
                }
            }


            aiFace* faces = 0;
            unsigned int nFaces = 0;

            if (prim.indices) {
                unsigned int count = prim.indices->count;

                Accessor::Indexer data = prim.indices->GetIndexer();
                ai_assert(data.IsValid());

                switch (prim.mode) {
                    case PrimitiveMode_POINTS: {
                        nFaces = count;
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; ++i) {
                            SetFace(faces[i], data.GetUInt(i));
                        }
                        break;
                    }

                    case PrimitiveMode_LINES: {
                        nFaces = count / 2;
                        if (nFaces * 2 != count) {
                            ASSIMP_LOG_WARN("The number of vertices was not compatible with the LINES mode. Some vertices were dropped.");
                            count = nFaces * 2;
                        }
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 2) {
                            SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
                        }
                        break;
                    }

                    case PrimitiveMode_LINE_LOOP:
                    case PrimitiveMode_LINE_STRIP: {
                        nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
                        for (unsigned int i = 2; i < count; ++i) {
                            SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
                        }
                        if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                            SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                        }
                        break;
                    }

                    case PrimitiveMode_TRIANGLES: {
                        nFaces = count / 3;
                        if (nFaces * 3 != count) {
                            ASSIMP_LOG_WARN("The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped.");
                            count = nFaces * 3;
                        }
                        faces = new aiFace[nFaces];
                        for (unsigned int i = 0; i < count; i += 3) {
                            SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_STRIP: {
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 3; i < count; ++i) {
                            SetFace(faces[i - 2], faces[i - 1].mIndices[1], faces[i - 1].mIndices[2], data.GetUInt(i));
                        }
                        break;
                    }
                    case PrimitiveMode_TRIANGLE_FAN:
                        nFaces = count - 2;
                        faces = new aiFace[nFaces];
                        SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
                        for (unsigned int i = 3; i < count; ++i) {
                            SetFace(faces[i - 2], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i));
                        }
                        break;
                }
            }
            else { // no indices provided so directly generate from counts

                // use the already determined count as it includes checks 
                unsigned int count = aim->mNumVertices;

                switch (prim.mode) {
                case PrimitiveMode_POINTS: {
                    nFaces = count;
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; ++i) {
                        SetFace(faces[i], i);
                    }
                    break;
                }

                case PrimitiveMode_LINES: {
                    nFaces = count / 2;
                    if (nFaces * 2 != count) {
                        ASSIMP_LOG_WARN("The number of vertices was not compatible with the LINES mode. Some vertices were dropped.");
                        count = nFaces * 2;
                    }
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 2) {
                        SetFace(faces[i / 2], i, i + 1);
                    }
                    break;
                }

                case PrimitiveMode_LINE_LOOP:
                case PrimitiveMode_LINE_STRIP: {
                    nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1);
                    for (unsigned int i = 2; i < count; ++i) {
                        SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
                    }
                    if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
                        SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
                    }
                    break;
                }

                case PrimitiveMode_TRIANGLES: {
                    nFaces = count / 3;
                    if (nFaces * 3 != count) {
                        ASSIMP_LOG_WARN("The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped.");
                        count = nFaces * 3;
                    }
                    faces = new aiFace[nFaces];
                    for (unsigned int i = 0; i < count; i += 3) {
                        SetFace(faces[i / 3], i, i + 1, i + 2);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_STRIP: {
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 3; i < count; ++i) {
                        SetFace(faces[i - 2], faces[i - 1].mIndices[1], faces[i - 1].mIndices[2], i);
                    }
                    break;
                }
                case PrimitiveMode_TRIANGLE_FAN:
                    nFaces = count - 2;
                    faces = new aiFace[nFaces];
                    SetFace(faces[0], 0, 1, 2);
                    for (unsigned int i = 3; i < count; ++i) {
                        SetFace(faces[i - 2], faces[0].mIndices[0], faces[i - 1].mIndices[2], i);
                    }
                    break;
                }
            }

            if (faces) {
                aim->mFaces = faces;
                aim->mNumFaces = nFaces;
                ai_assert(CheckValidFacesIndices(faces, nFaces, aim->mNumVertices));
            }

            if (prim.material) {
                aim->mMaterialIndex = prim.material.GetIndex();
            }
        }
    }

    meshOffsets.push_back(k);

    CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}